

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathFreeParserContext(xmlXPathParserContextPtr ctxt)

{
  int local_14;
  int i;
  xmlXPathParserContextPtr ctxt_local;
  
  if (ctxt->valueTab != (xmlXPathObjectPtr *)0x0) {
    for (local_14 = 0; local_14 < ctxt->valueNr; local_14 = local_14 + 1) {
      if (ctxt->context == (xmlXPathContextPtr)0x0) {
        xmlXPathFreeObject(ctxt->valueTab[local_14]);
      }
      else {
        xmlXPathReleaseObject(ctxt->context,ctxt->valueTab[local_14]);
      }
    }
    (*xmlFree)(ctxt->valueTab);
  }
  if (ctxt->comp != (xmlXPathCompExprPtr)0x0) {
    if (ctxt->comp->stream != (xmlPatternPtr)0x0) {
      xmlFreePatternList(ctxt->comp->stream);
      ctxt->comp->stream = (xmlPatternPtr)0x0;
    }
    xmlXPathFreeCompExpr(ctxt->comp);
  }
  (*xmlFree)(ctxt);
  return;
}

Assistant:

void
xmlXPathFreeParserContext(xmlXPathParserContextPtr ctxt) {
    int i;

    if (ctxt->valueTab != NULL) {
        for (i = 0; i < ctxt->valueNr; i++) {
            if (ctxt->context)
                xmlXPathReleaseObject(ctxt->context, ctxt->valueTab[i]);
            else
                xmlXPathFreeObject(ctxt->valueTab[i]);
        }
        xmlFree(ctxt->valueTab);
    }
    if (ctxt->comp != NULL) {
#ifdef XPATH_STREAMING
	if (ctxt->comp->stream != NULL) {
	    xmlFreePatternList(ctxt->comp->stream);
	    ctxt->comp->stream = NULL;
	}
#endif
	xmlXPathFreeCompExpr(ctxt->comp);
    }
    xmlFree(ctxt);
}